

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

void __thiscall
google::protobuf::OneofDescriptorProto::OneofDescriptorProto(OneofDescriptorProto *this)

{
  Arena *in_RDI;
  Message *in_stack_ffffffffffffffd0;
  OneofDescriptorProto *this_00;
  
  Message::Message(in_stack_ffffffffffffffd0);
  (in_RDI->impl_).threads_._M_b._M_p = (__pointer_type)&PTR__OneofDescriptorProto_0096a570;
  this_00 = (OneofDescriptorProto *)&(in_RDI->impl_).hint_;
  internal::InternalMetadataWithArena::InternalMetadataWithArena
            ((InternalMetadataWithArena *)this_00,in_RDI);
  memset(&(in_RDI->impl_).space_allocated_,0,4);
  internal::CachedSize::CachedSize((CachedSize *)0x51c9ce);
  SharedCtor(this_00);
  return;
}

Assistant:

OneofDescriptorProto::OneofDescriptorProto()
  : ::PROTOBUF_NAMESPACE_ID::Message(), _internal_metadata_(nullptr) {
  SharedCtor();
  // @@protoc_insertion_point(constructor:google.protobuf.OneofDescriptorProto)
}